

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::OurReader::readToken(OurReader *this,Token *token)

{
  char cVar1;
  char *pcVar2;
  int patternLength;
  bool bVar3;
  Location pattern;
  
  skipSpaces(this);
  pcVar2 = this->current_;
  token->start_ = pcVar2;
  if (pcVar2 == this->end_) {
LAB_0010d4da:
    token->type_ = tokenEndOfStream;
    goto LAB_0010d603;
  }
  this->current_ = pcVar2 + 1;
  cVar1 = *pcVar2;
  switch(cVar1) {
  case '\"':
    token->type_ = tokenString;
    bVar3 = readString(this);
    goto LAB_0010d5f9;
  case '#':
  case '$':
  case '%':
  case '&':
  case '(':
  case ')':
  case '*':
  case '+':
  case '.':
  case ';':
  case '<':
  case '=':
  case '>':
  case '?':
  case '@':
  case 'A':
  case 'B':
  case 'C':
  case 'D':
  case 'E':
  case 'F':
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'L':
  case 'M':
    break;
  case '\'':
    if ((this->features_).allowSingleQuotes_ != true) goto switchD_0010d475_caseD_2f;
    token->type_ = tokenString;
    bVar3 = readStringSingleQuote(this);
    goto LAB_0010d5f9;
  case ',':
    token->type_ = tokenArraySeparator;
    goto LAB_0010d603;
  case '-':
    bVar3 = readNumber(this,true);
    if (bVar3) {
      token->type_ = tokenNumber;
      goto LAB_0010d603;
    }
    token->type_ = tokenNegInf;
    if ((this->features_).allowSpecialFloats_ != false) goto LAB_0010d5e7;
    break;
  case '/':
switchD_0010d475_caseD_2f:
    token->type_ = tokenComment;
    bVar3 = readComment(this);
    goto LAB_0010d5f9;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    token->type_ = tokenNumber;
    readNumber(this,false);
    goto LAB_0010d603;
  case ':':
    token->type_ = tokenMemberSeparator;
    goto LAB_0010d603;
  case 'I':
    if ((this->features_).allowSpecialFloats_ == true) {
      token->type_ = tokenPosInf;
LAB_0010d5e7:
      pattern = "nfinity";
      patternLength = 7;
      goto LAB_0010d5f0;
    }
    break;
  case 'N':
    if ((this->features_).allowSpecialFloats_ == true) {
      token->type_ = tokenNaN;
      pattern = "aN";
      patternLength = 2;
      goto LAB_0010d5f0;
    }
    break;
  default:
    if (cVar1 == '\0') goto LAB_0010d4da;
    if (cVar1 == '[') {
      token->type_ = tokenArrayBegin;
      goto LAB_0010d603;
    }
    if (cVar1 == ']') {
      token->type_ = tokenArrayEnd;
      goto LAB_0010d603;
    }
    if (cVar1 == 'f') {
      token->type_ = tokenFalse;
      pattern = "alse";
      patternLength = 4;
    }
    else {
      if (cVar1 == 'n') {
        token->type_ = tokenNull;
        pcVar2 = "null";
      }
      else {
        if (cVar1 != 't') {
          if (cVar1 == '}') {
            token->type_ = tokenObjectEnd;
            goto LAB_0010d603;
          }
          if (cVar1 == '{') {
            token->type_ = tokenObjectBegin;
            goto LAB_0010d603;
          }
          break;
        }
        token->type_ = tokenTrue;
        pcVar2 = "true";
      }
      pattern = pcVar2 + 1;
      patternLength = 3;
    }
LAB_0010d5f0:
    bVar3 = match(this,pattern,patternLength);
LAB_0010d5f9:
    if (bVar3 != false) goto LAB_0010d603;
  }
  token->type_ = tokenError;
LAB_0010d603:
  token->end_ = this->current_;
  return true;
}

Assistant:

bool OurReader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '\'':
    if (features_.allowSingleQuotes_) {
    token.type_ = tokenString;
    ok = readStringSingleQuote();
    break;
    } // else continue
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    token.type_ = tokenNumber;
    readNumber(false);
    break;
  case '-':
    if (readNumber(true)) {
      token.type_ = tokenNumber;
    } else {
      token.type_ = tokenNegInf;
      ok = features_.allowSpecialFloats_ && match("nfinity", 7);
    }
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case 'N':
    if (features_.allowSpecialFloats_) {
      token.type_ = tokenNaN;
      ok = match("aN", 2);
    } else {
      ok = false;
    }
    break;
  case 'I':
    if (features_.allowSpecialFloats_) {
      token.type_ = tokenPosInf;
      ok = match("nfinity", 7);
    } else {
      ok = false;
    }
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return true;
}